

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::CheckProgram(DrawIndirectBase *this,GLuint program)

{
  long lVar1;
  CallLogWrapper *this_00;
  GLint length_1;
  GLint attached_shaders;
  GLint length;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLenum type;
  GLint progStatus;
  vector<char,_std::allocator<char>_> source;
  DIResult status;
  int local_388;
  int local_384;
  GLuint *local_380;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  GLuint local_35c;
  int local_358;
  int local_354;
  _Vector_base<char,_std::allocator<char>_> local_350;
  DILogger local_338;
  DIResult local_1b8;
  
  DIResult::DIResult(&local_1b8);
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_354);
  if (local_354 == 0) {
    DIResult::error(&local_338,&local_1b8);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_338,(char (*) [24])"GL_LINK_STATUS is false");
    DILogger::~DILogger(&local_338);
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_384);
    if (0 < (long)local_384) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_378,(long)local_384,
                 (allocator_type *)&local_338);
      local_35c = program;
      glu::CallLogWrapper::glGetAttachedShaders
                (this_00,program,local_384,(GLsizei *)0x0,
                 local_378._M_impl.super__Vector_impl_data._M_start);
      for (lVar1 = 0; lVar1 < local_384; lVar1 = lVar1 + 1) {
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,local_378._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b4f,
                   &local_358);
        if (local_358 == 0x8b30) {
          DIResult::error(&local_338,&local_1b8);
          if (local_338.null_log_ == false) {
            std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            "*** Fragment Shader ***\n");
          }
        }
        else if (local_358 == 0x8b31) {
          DIResult::error(&local_338,&local_1b8);
          if (local_338.null_log_ == false) {
            std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            "*** Vertex Shader ***\n");
          }
        }
        else if (local_358 == 0x91b9) {
          DIResult::error(&local_338,&local_1b8);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_338,(char (*) [24])"*** Compute Shader ***\n");
        }
        else {
          DIResult::error(&local_338,&local_1b8);
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_338,(char (*) [24])"*** Unknown Shader ***\n");
        }
        DILogger::~DILogger(&local_338);
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,local_378._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b88,
                   &local_388);
        if (0 < (long)local_388) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_350,(long)local_388,
                     (allocator_type *)&local_338);
          glu::CallLogWrapper::glGetShaderSource
                    (this_00,local_378._M_impl.super__Vector_impl_data._M_start[lVar1],local_388,
                     (GLsizei *)0x0,local_350._M_impl.super__Vector_impl_data._M_start);
          DIResult::error(&local_338,&local_1b8);
          if (local_338.null_log_ == false) {
            std::operator<<(&local_338.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            *local_350._M_impl.super__Vector_impl_data._M_start);
          }
          DILogger::~DILogger(&local_338);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_350);
        }
        glu::CallLogWrapper::glGetShaderiv
                  (this_00,local_378._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b84,
                   &local_388);
        if (0 < (long)local_388) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_350,(long)local_388,
                     (allocator_type *)&local_338);
          glu::CallLogWrapper::glGetShaderInfoLog
                    (this_00,local_378._M_impl.super__Vector_impl_data._M_start[lVar1],local_388,
                     (GLsizei *)0x0,local_350._M_impl.super__Vector_impl_data._M_start);
          DIResult::error(&local_338,&local_1b8);
          local_380 = (GLuint *)local_350._M_impl.super__Vector_impl_data._M_start;
          glcts::(anonymous_namespace)::DILogger::operator<<
                    ((DILogger *)&local_338,(char **)&local_380);
          DILogger::~DILogger(&local_338);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_350);
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_378);
      program = local_35c;
    }
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_380);
    if (0 < (long)(int)local_380) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_378,(long)(int)local_380,
                 (allocator_type *)&local_338);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,program,(int)local_380,(GLsizei *)0x0,
                 (GLchar *)local_378._M_impl.super__Vector_impl_data._M_start);
      DIResult::error(&local_338,&local_1b8);
      local_350._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_378._M_impl.super__Vector_impl_data._M_start;
      glcts::(anonymous_namespace)::DILogger::operator<<((DILogger *)&local_338,(char **)&local_350)
      ;
      DILogger::~DILogger(&local_338);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_378);
    }
  }
  DILogger::~DILogger(&local_1b8.logger_);
  return (ulong)(local_1b8.status_ == 0);
}

Assistant:

long CheckProgram(GLuint program)
	{
		DIResult status;
		GLint	progStatus;
		glGetProgramiv(program, GL_LINK_STATUS, &progStatus);

		if (progStatus == GL_FALSE)
		{

			status.error() << "GL_LINK_STATUS is false";

			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					// shader type
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						status.error() << "*** Vertex Shader ***\n";
						break;
					case GL_FRAGMENT_SHADER:
						status.error() << "*** Fragment Shader ***\n";
						break;
					case GL_COMPUTE_SHADER:
						status.error() << "*** Compute Shader ***\n";
						break;
					default:
						status.error() << "*** Unknown Shader ***\n";
						break;
					}

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						status.error() << source[0];
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						status.error() << &log[0];
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				status.error() << &log[0];
			}
		}

		return status.code() == NO_ERROR;
	}